

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

void __thiscall
SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
Iterate<InterpreterThunkEmitter::Close()::__0>
          (SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  Iterator local_40;
  
  local_40.list = (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)this;
  local_40.current = (NodeBase *)this;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if ((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)this ==
        (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      this = (SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)local_40.current;
    }
    local_40.current =
         (((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)this)->
         super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        local_40.list) break;
    pTVar4 = SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    PDataManager::UnregisterPdata((RUNTIME_FUNCTION *)pTVar4->registeredPdataTable);
    this = (SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)local_40.current;
  }
  return;
}

Assistant:

void Iterate(Fn fn)
    {
        Iterator iter(this);
        while(iter.Next())
        {
            fn(iter.Data());
        }
    }